

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12.c
# Opt level: O0

int pkcs12_pbe_derive_key_iv
              (mbedtls_asn1_buf *pbe_params,mbedtls_md_type_t md_type,uchar *pwd,size_t pwdlen,
              uchar *key,size_t keylen,uchar *iv,size_t ivlen)

{
  uchar local_178;
  uchar auStack_177 [7];
  uchar unipwd [258];
  ulong local_68;
  size_t i;
  mbedtls_asn1_buf salt;
  int iterations;
  int ret;
  size_t keylen_local;
  uchar *key_local;
  size_t pwdlen_local;
  uchar *pwd_local;
  mbedtls_md_type_t md_type_local;
  mbedtls_asn1_buf *pbe_params_local;
  
  salt.p._0_4_ = 0;
  if (pwdlen < 0x81) {
    memset(&i,0,0x18);
    memset(&local_178,0,0x102);
    pbe_params_local._4_4_ =
         pkcs12_parse_pbe_params(pbe_params,(mbedtls_asn1_buf *)&i,(int *)&salt.p);
    if (pbe_params_local._4_4_ == 0) {
      salt.p._4_4_ = 0;
      for (local_68 = 0; local_68 < pwdlen; local_68 = local_68 + 1) {
        auStack_177[local_68 * 2] = pwd[local_68];
      }
      salt.p._4_4_ = mbedtls_pkcs12_derivation
                               (key,keylen,&local_178,pwdlen * 2 + 2,(uchar *)salt.len,salt._0_8_,
                                md_type,1,(int)salt.p);
      pbe_params_local._4_4_ = salt.p._4_4_;
      if (salt.p._4_4_ == 0) {
        if ((iv == (uchar *)0x0) || (ivlen == 0)) {
          pbe_params_local._4_4_ = 0;
        }
        else {
          pbe_params_local._4_4_ =
               mbedtls_pkcs12_derivation
                         (iv,ivlen,&local_178,pwdlen * 2 + 2,(uchar *)salt.len,salt._0_8_,md_type,2,
                          (int)salt.p);
          if (pbe_params_local._4_4_ == 0) {
            pbe_params_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    pbe_params_local._4_4_ = -0x1f80;
  }
  return pbe_params_local._4_4_;
}

Assistant:

static int pkcs12_pbe_derive_key_iv( mbedtls_asn1_buf *pbe_params, mbedtls_md_type_t md_type,
                                     const unsigned char *pwd,  size_t pwdlen,
                                     unsigned char *key, size_t keylen,
                                     unsigned char *iv,  size_t ivlen )
{
    int ret, iterations = 0;
    mbedtls_asn1_buf salt;
    size_t i;
    unsigned char unipwd[PKCS12_MAX_PWDLEN * 2 + 2];

    if( pwdlen > PKCS12_MAX_PWDLEN )
        return( MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA );

    memset( &salt, 0, sizeof(mbedtls_asn1_buf) );
    memset( &unipwd, 0, sizeof(unipwd) );

    if( ( ret = pkcs12_parse_pbe_params( pbe_params, &salt,
                                         &iterations ) ) != 0 )
        return( ret );

    for( i = 0; i < pwdlen; i++ )
        unipwd[i * 2 + 1] = pwd[i];

    if( ( ret = mbedtls_pkcs12_derivation( key, keylen, unipwd, pwdlen * 2 + 2,
                                   salt.p, salt.len, md_type,
                                   MBEDTLS_PKCS12_DERIVE_KEY, iterations ) ) != 0 )
    {
        return( ret );
    }

    if( iv == NULL || ivlen == 0 )
        return( 0 );

    if( ( ret = mbedtls_pkcs12_derivation( iv, ivlen, unipwd, pwdlen * 2 + 2,
                                   salt.p, salt.len, md_type,
                                   MBEDTLS_PKCS12_DERIVE_IV, iterations ) ) != 0 )
    {
        return( ret );
    }
    return( 0 );
}